

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O1

int fits_unshuffle_2bytes(char *heap,LONGLONG length,int *status)

{
  size_t __size;
  int extraout_EAX;
  void *__src;
  long lVar1;
  
  __size = length * 2;
  __src = malloc(__size);
  if (0 < length) {
    lVar1 = 0;
    do {
      *(char *)((long)__src + lVar1 * 2 + (__size - 1)) = heap[lVar1 + (__size - 1)];
      *(char *)((long)__src + lVar1 * 2 + (__size - 2)) = heap[lVar1 + length + -1];
      lVar1 = lVar1 + -1;
    } while (-lVar1 != length);
  }
  memcpy(heap,__src,__size);
  free(__src);
  return extraout_EAX;
}

Assistant:

static int fits_unshuffle_2bytes(char *heap, LONGLONG length, int *status)

/* unshuffle the bytes in an array of 2-byte integers */

{
    LONGLONG ii;
    char *ptr, *cptr, *heapptr;
    
    ptr = malloc((size_t) (length * 2));
    heapptr = heap + (2 * length) - 1;
    cptr = ptr + (2 * length) - 1;
    
    for (ii = 0; ii < length; ii++) {
       *cptr = *heapptr;
       cptr--;
       *cptr = *(heapptr - length);
       cptr--;
       heapptr--;
    }
         
    memcpy(heap, ptr, (size_t) (length * 2));
    free(ptr);
    return(*status);
}